

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * str_xor(string *s,char *t)

{
  byte bVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong uVar3;
  byte *pbVar4;
  byte *in_RDX;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  char *pc;
  string *r;
  allocator<char> *in_stack_ffffffffffffff98;
  ulong uVar5;
  string *__n;
  ulong local_40;
  allocator<char> local_22;
  undefined1 local_21;
  byte *local_20;
  byte *local_18;
  ulong local_10;
  
  local_21 = 0;
  __n = in_RDI;
  local_20 = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(size_type)__n,(char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff98);
  std::allocator<char>::~allocator(&local_22);
  local_40 = 0;
  while (uVar5 = local_40, uVar3 = std::__cxx11::string::size(), uVar5 < uVar3) {
    if (*local_20 == 0) {
      local_20 = local_18;
    }
    pbVar4 = (byte *)std::__cxx11::string::operator[](local_10);
    bVar1 = *pbVar4;
    bVar2 = *local_20;
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)__n);
    *pbVar4 = bVar1 ^ bVar2;
    local_40 = local_40 + 1;
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

std::string str_xor (const std::string& s, const char* t)
{
    const char* pc = t;
    std::string r ( s.size(), '\0');
    for (size_t i = 0; i < s.size(); ++i, ++pc) {
        if (!(*pc)) pc = t;                     // restart at end of string
        r[i] = s[i] ^ *pc;
    }
    return r;
}